

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbounds.hpp
# Opt level: O1

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::clearDualBounds(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this,Status stat,
                 number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *upp,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *lw)

{
  double a;
  long lVar1;
  uint uVar2;
  cpp_dec_float<200u,int,void> *pcVar3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar4;
  long in_FS_OFFSET;
  byte bVar5;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined5 uStack_40;
  undefined3 uStack_3b;
  int iStack_38;
  bool bStack_34;
  undefined8 local_30;
  
  bVar5 = 0;
  uVar2 = stat + D_ON_BOTH;
  if (uVar2 < 0xb) {
    if ((0x81U >> (uVar2 & 0x1f) & 1) == 0) {
      if ((0x104U >> (uVar2 & 0x1f) & 1) == 0) {
        if ((0x410U >> (uVar2 & 0x1f) & 1) == 0) {
          return;
        }
        ::soplex::infinity::__tls_init();
        local_30 = 0x1c00000000;
        local_a8 = 0;
        uStack_a0 = 0;
        local_98 = 0;
        uStack_90 = 0;
        local_88 = 0;
        uStack_80 = 0;
        local_78 = 0;
        uStack_70 = 0;
        local_68 = 0;
        uStack_60 = 0;
        local_58 = 0;
        uStack_50 = 0;
        local_48 = 0;
        uStack_40 = 0;
        uStack_3b = 0;
        iStack_38 = 0;
        bStack_34 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_a8,*(double *)(in_FS_OFFSET + -8));
        pcVar3 = (cpp_dec_float<200u,int,void> *)&local_a8;
        pnVar4 = upp;
        for (lVar1 = 0x1c; lVar1 != 0; lVar1 = lVar1 + -1) {
          (pnVar4->m_backend).data._M_elems[0] = *(uint *)pcVar3;
          pcVar3 = pcVar3 + (ulong)bVar5 * -8 + 4;
          pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)((long)pnVar4 + ((ulong)bVar5 * -2 + 1) * 4);
        }
        (upp->m_backend).exp = iStack_38;
        (upp->m_backend).neg = bStack_34;
        (upp->m_backend).fpclass = (undefined4)local_30;
        (upp->m_backend).prec_elem = local_30._4_4_;
        return;
      }
      ::soplex::infinity::__tls_init();
      local_b8 = (undefined4)*(undefined8 *)(in_FS_OFFSET + -8);
      uStack_b4 = (undefined4)((ulong)*(undefined8 *)(in_FS_OFFSET + -8) >> 0x20);
    }
    else {
      ::soplex::infinity::__tls_init();
      a = *(double *)(in_FS_OFFSET + -8);
      local_30 = 0x1c00000000;
      local_a8 = 0;
      uStack_a0 = 0;
      local_98 = 0;
      uStack_90 = 0;
      local_88 = 0;
      uStack_80 = 0;
      local_78 = 0;
      uStack_70 = 0;
      local_68 = 0;
      uStack_60 = 0;
      local_58 = 0;
      uStack_50 = 0;
      local_48 = 0;
      uStack_40 = 0;
      uStack_3b = 0;
      iStack_38 = 0;
      bStack_34 = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_a8,a);
      pcVar3 = (cpp_dec_float<200u,int,void> *)&local_a8;
      pnVar4 = upp;
      for (lVar1 = 0x1c; lVar1 != 0; lVar1 = lVar1 + -1) {
        (pnVar4->m_backend).data._M_elems[0] = *(uint *)pcVar3;
        pcVar3 = pcVar3 + (ulong)bVar5 * -8 + 4;
        pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)pnVar4 + ((ulong)bVar5 * -2 + 1) * 4);
      }
      (upp->m_backend).exp = iStack_38;
      (upp->m_backend).neg = bStack_34;
      (upp->m_backend).fpclass = (undefined4)local_30;
      (upp->m_backend).prec_elem = local_30._4_4_;
      ::soplex::infinity::__tls_init();
      local_b8 = SUB84(a,0);
      uStack_b4 = (undefined4)((ulong)a >> 0x20);
    }
    local_30 = 0x1c00000000;
    local_a8 = 0;
    uStack_a0 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_48 = 0;
    uStack_40 = 0;
    uStack_3b = 0;
    iStack_38 = 0;
    bStack_34 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_a8,-(double)CONCAT44(uStack_b4,local_b8));
    pcVar3 = (cpp_dec_float<200u,int,void> *)&local_a8;
    pnVar4 = lw;
    for (lVar1 = 0x1c; lVar1 != 0; lVar1 = lVar1 + -1) {
      (pnVar4->m_backend).data._M_elems[0] = *(uint *)pcVar3;
      pcVar3 = pcVar3 + (ulong)bVar5 * -8 + 4;
      pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar4 + ((ulong)bVar5 * -2 + 1) * 4);
    }
    (lw->m_backend).exp = iStack_38;
    (lw->m_backend).neg = bStack_34;
    (lw->m_backend).fpclass = (undefined4)local_30;
    (lw->m_backend).prec_elem = local_30._4_4_;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::clearDualBounds(
   typename SPxBasisBase<R>::Desc::Status stat,
   R&                  upp,
   R&                  lw) const
{

   switch(stat)
   {
   case SPxBasisBase<R>::Desc::P_ON_UPPER + SPxBasisBase<R>::Desc::P_ON_LOWER :
   case SPxBasisBase<R>::Desc::D_FREE :
      upp = R(infinity);
      lw  = R(-infinity);
      break;

   case SPxBasisBase<R>::Desc::P_ON_UPPER :
   case SPxBasisBase<R>::Desc::D_ON_LOWER :
      upp = R(infinity);
      break;

   case SPxBasisBase<R>::Desc::P_ON_LOWER :
   case SPxBasisBase<R>::Desc::D_ON_UPPER :
      lw  = R(-infinity);
      break;

   default:
      break;
   }
}